

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_alpha.cpp
# Opt level: O1

void __thiscall
QAlphaPaintEngine::drawPolygon
          (QAlphaPaintEngine *this,QPointF *points,int pointCount,PolygonDrawMode mode)

{
  QAlphaPaintEnginePrivate *this_00;
  QPaintEngine *pQVar1;
  bool bVar2;
  ulong uVar3;
  QPointF *args;
  long in_FS_OFFSET;
  QPainterPath path;
  QRectF local_88;
  undefined8 local_60;
  undefined1 local_58 [16];
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAlphaPaintEnginePrivate **)&this->field_0x18;
  local_58 = (undefined1  [16])0x0;
  local_48 = 0;
  QList<QPointF>::reserve((QList<QPointF> *)local_58,(long)pointCount);
  if (0 < pointCount) {
    uVar3 = (ulong)(uint)pointCount;
    args = points;
    do {
      QtPrivate::QPodArrayOps<QPointF>::emplace<QPointF_const&>
                ((QPodArrayOps<QPointF> *)local_58,local_48,args);
      QList<QPointF>::end((QList<QPointF> *)local_58);
      args = args + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  local_60 = 0xaaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_60);
  QPainterPath::addPolygon((QPolygonF *)&local_60);
  local_88.w._0_4_ = 0xffffffff;
  local_88.w._4_4_ = 0xffffffff;
  local_88.h._0_4_ = 0xffffffff;
  local_88.h._4_4_ = 0xffffffff;
  local_88.xp._0_4_ = 0xffffffff;
  local_88.xp._4_4_ = 0xffffffff;
  local_88.yp._0_4_ = 0xffffffff;
  local_88.yp._4_4_ = 0xffffffff;
  QAlphaPaintEnginePrivate::addPenWidth(&local_88,this_00,(QPainterPath *)&local_60);
  if (this_00->m_pass == 0) {
    this_00->m_continueCall = false;
    bVar2 = QAlphaPaintEnginePrivate::canSeeTroughBackground(this_00,this_00->m_hasalpha,&local_88);
    if ((((bVar2) || (this_00->m_advancedPen != false)) || (this_00->m_advancedBrush != false)) ||
       (this_00->m_emulateProjectiveTransforms == true)) {
      QAlphaPaintEnginePrivate::addAlphaRect(this_00,&local_88);
    }
    QAlphaPaintEnginePrivate::addDirtyRect(this_00,&local_88);
    pQVar1 = this_00->m_picengine;
    if (pQVar1 != (QPaintEngine *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x70))(pQVar1,points,pointCount,mode);
    }
  }
  else {
    bVar2 = QAlphaPaintEnginePrivate::fullyContained(this_00,&local_88);
    this_00->m_continueCall = !bVar2;
  }
  QPainterPath::~QPainterPath((QPainterPath *)&local_60);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAlphaPaintEngine::drawPolygon(const QPointF *points, int pointCount, PolygonDrawMode mode)
{
    Q_D(QAlphaPaintEngine);

    QPolygonF poly;
    poly.reserve(pointCount);
    for (int i = 0; i < pointCount; ++i)
        poly.append(points[i]);

    QPainterPath path;
    path.addPolygon(poly);
    QRectF tr = d->addPenWidth(path);

    if (d->m_pass == 0) {
        d->m_continueCall = false;
        if (d->canSeeTroughBackground(d->m_hasalpha, tr) || d->m_advancedPen || d->m_advancedBrush
            || d->m_emulateProjectiveTransforms)
        {
            d->addAlphaRect(tr);
        }

        d->addDirtyRect(tr);

        if (d->m_picengine)
            d->m_picengine->drawPolygon(points, pointCount, mode);
    } else {
        d->m_continueCall = !d->fullyContained(tr);
    }
}